

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildDescription.cpp
# Opt level: O3

Tool * __thiscall
llbuild::buildsystem::BuildDescription::addTool
          (BuildDescription *this,
          unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>
          *value)

{
  Tool *pTVar1;
  long lVar2;
  Tool *pTVar3;
  long *plVar4;
  StringRef Key;
  pair<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_bool>
  pVar5;
  
  pTVar1 = (value->_M_t).
           super___uniq_ptr_impl<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>
           ._M_t.
           super__Tuple_impl<0UL,_llbuild::buildsystem::Tool_*,_std::default_delete<llbuild::buildsystem::Tool>_>
           .super__Head_base<0UL,_llbuild::buildsystem::Tool_*,_false>._M_head_impl;
  Key.Data = (pTVar1->name)._M_dataplus._M_p;
  Key.Length = (pTVar1->name)._M_string_length;
  pVar5 = llvm::
          StringMap<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>,_llvm::MallocAllocator>
          ::try_emplace<>(&this->tools,Key);
  lVar2 = *(long *)pVar5.first.
                   super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_>
                   .Ptr.
                   super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_>
  ;
  pTVar3 = (value->_M_t).
           super___uniq_ptr_impl<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>
           ._M_t.
           super__Tuple_impl<0UL,_llbuild::buildsystem::Tool_*,_std::default_delete<llbuild::buildsystem::Tool>_>
           .super__Head_base<0UL,_llbuild::buildsystem::Tool_*,_false>._M_head_impl;
  (value->_M_t).
  super___uniq_ptr_impl<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>
  ._M_t.
  super__Tuple_impl<0UL,_llbuild::buildsystem::Tool_*,_std::default_delete<llbuild::buildsystem::Tool>_>
  .super__Head_base<0UL,_llbuild::buildsystem::Tool_*,_false>._M_head_impl = (Tool *)0x0;
  plVar4 = *(long **)(lVar2 + 8);
  *(Tool **)(lVar2 + 8) = pTVar3;
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 8))();
  }
  return pTVar1;
}

Assistant:

Tool& BuildDescription::addTool(std::unique_ptr<Tool> value) {
  auto& result = *value.get();
  getTools()[value->getName()] = std::move(value);
  return result;
}